

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.hh
# Opt level: O0

bool __thiscall
tchecker::parsing::system_declaration_t::
insert_declaration<tchecker::parsing::location_declaration_t>
          (system_declaration_t *this,string *name,
          shared_ptr<tchecker::parsing::location_declaration_t> *d,
          declaration_map_t<tchecker::parsing::location_declaration_t> *m)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>_>_>
  *this_00;
  bool bVar1;
  byte bVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>,_false,_true>,_bool>
  pVar3;
  shared_ptr<tchecker::parsing::inner_declaration_t> local_a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>,_true>
  local_90;
  byte local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>
  local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>,_true>
  local_40;
  byte local_38;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>_>_>
  *local_30;
  declaration_map_t<tchecker::parsing::location_declaration_t> *m_local;
  shared_ptr<tchecker::parsing::location_declaration_t> *d_local;
  string *name_local;
  system_declaration_t *this_local;
  
  local_30 = m;
  m_local = (declaration_map_t<tchecker::parsing::location_declaration_t> *)d;
  d_local = (shared_ptr<tchecker::parsing::location_declaration_t> *)name;
  name_local = (string *)this;
  bVar1 = std::operator!=(d,(nullptr_t)0x0);
  this_00 = local_30;
  if (bVar1) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>,_true>
              (&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)d_local,
               (shared_ptr<tchecker::parsing::location_declaration_t> *)m_local);
    pVar3 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>_>_>
            ::insert(this_00,&local_70);
    local_90._M_cur =
         (__node_type *)
         pVar3.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>,_true>
         ._M_cur;
    local_88 = pVar3.second;
    bVar2 = local_88 ^ 0xff;
    local_40._M_cur = local_90._M_cur;
    local_38 = local_88;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::location_declaration_t>_>
    ::~pair(&local_70);
    bVar1 = (bVar2 & 1) == 0;
    if (bVar1) {
      std::shared_ptr<tchecker::parsing::inner_declaration_t>::
      shared_ptr<tchecker::parsing::location_declaration_t,void>
                (&local_a0,(shared_ptr<tchecker::parsing::location_declaration_t> *)m_local);
      std::
      vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>
      ::push_back(&this->_decl,&local_a0);
      std::shared_ptr<tchecker::parsing::inner_declaration_t>::~shared_ptr(&local_a0);
    }
    return bVar1;
  }
  __assert_fail("d != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/parsing/declaration.hh"
                ,0x478,
                "bool tchecker::parsing::system_declaration_t::insert_declaration(const std::string &, const std::shared_ptr<T> &, declaration_map_t<T> &) [T = tchecker::parsing::location_declaration_t]"
               );
}

Assistant:

bool insert_declaration(std::string const & name, std::shared_ptr<T> const & d, declaration_map_t<T> & m)
  {
    assert(d != nullptr);
    if (!m.insert({name, d}).second)
      return false;
    _decl.push_back(d);
    return true;
  }